

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_optimizations.cpp
# Opt level: O0

void duckdb::AddCodepoint(int32_t codepoint,LikeString *ret,bool contains)

{
  bool bVar1;
  byte in_DL;
  undefined1 *in_RSI;
  int in_EDI;
  idx_t i;
  char utf8_str [4];
  int sz;
  LikeString *ret_00;
  char local_1c [3];
  char in_stack_ffffffffffffffe7;
  int local_18;
  byte local_11;
  undefined1 *local_10;
  
  local_11 = in_DL & 1;
  local_18 = 0;
  local_10 = in_RSI;
  bVar1 = Utf8Proc::CodepointToUtf8(in_EDI,&local_18,local_1c);
  if (bVar1) {
    for (ret_00 = (LikeString *)0x0; ret_00 < (LikeString *)(long)local_18;
        ret_00 = (LikeString *)&ret_00->escaped) {
      AddCharacter(in_stack_ffffffffffffffe7,ret_00,false);
    }
  }
  else {
    *local_10 = 0;
  }
  return;
}

Assistant:

static void AddCodepoint(int32_t codepoint, LikeString &ret, bool contains) {
	int sz = 0;
	char utf8_str[4];
	if (!Utf8Proc::CodepointToUtf8(codepoint, sz, utf8_str)) {
		// invalid codepoint
		ret.exists = false;
		return;
	}
	for (idx_t i = 0; i < idx_t(sz); i++) {
		AddCharacter(utf8_str[i], ret, contains);
	}
}